

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  BYTE *pInLimit;
  long *plVar1;
  long *plVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  int *op;
  undefined8 uVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  seqDef *psVar14;
  long *plVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  ulong uVar24;
  long lVar25;
  long *plVar26;
  int iVar27;
  long *plVar28;
  int iVar29;
  ulong uVar30;
  long *plVar31;
  ulong uVar32;
  U32 UVar33;
  uint uVar34;
  uint uVar35;
  U32 maxDistance;
  uint uVar36;
  int iVar37;
  U32 UVar38;
  uint uVar39;
  BYTE *litEnd;
  long *plVar40;
  long *plVar41;
  uint local_f0;
  long local_e0;
  uint local_d4;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  pBVar4 = (ms->window).base;
  uVar36 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar29 = (int)pBVar4;
  iVar37 = (int)pInLimit - iVar29;
  uVar11 = (ms->window).lowLimit;
  uVar34 = uVar11;
  if (uVar36 < iVar37 - uVar11) {
    uVar34 = iVar37 - uVar36;
  }
  UVar33 = ms->loadedDictEnd;
  if (UVar33 != 0) {
    uVar34 = uVar11;
  }
  pUVar5 = ms->hashTable;
  plVar2 = (long *)((long)src + (srcSize - 8));
  pUVar6 = ms->chainTable;
  uVar11 = (ms->window).dictLimit;
  uVar35 = *rep;
  local_d4 = rep[1];
  cVar9 = (char)(ms->cParams).chainLog;
  cVar10 = (char)(ms->cParams).hashLog;
  plVar31 = (long *)src;
  if (uVar34 < uVar11) {
    pBVar7 = (ms->window).dictBase;
    plVar26 = (long *)(pBVar4 + uVar11);
    plVar1 = (long *)(pBVar7 + uVar34);
    pBVar20 = pBVar7 + uVar11;
    bVar16 = 0x40 - cVar9;
    bVar17 = 0x20 - cVar9;
    bVar18 = 0x40 - cVar10;
    plVar15 = (long *)(pInLimit + -0x20);
LAB_005af00f:
    do {
      if (plVar2 <= src) {
        *rep = uVar35;
LAB_005b02b5:
        rep[1] = local_d4;
        return (long)pInLimit - (long)plVar31;
      }
      uVar32 = (ulong)(mls - 5);
      switch(uVar32) {
      case 0:
        lVar13 = *src;
        lVar25 = -0x30e4432345000000;
        break;
      case 1:
        lVar13 = *src;
        lVar25 = -0x30e4432340650000;
        break;
      case 2:
        lVar13 = *src;
        lVar25 = -0x30e44323405a9d00;
        break;
      case 3:
        lVar13 = *src;
        uVar24 = lVar13 * -0x30e44323485a9b9d;
        goto LAB_005af079;
      default:
        uVar24 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar17 & 0x1f));
        lVar13 = *src;
        goto LAB_005af081;
      }
      uVar24 = lVar25 * lVar13;
LAB_005af079:
      uVar24 = uVar24 >> (bVar16 & 0x3f);
LAB_005af081:
      uVar36 = pUVar6[uVar24];
      pBVar21 = pBVar4;
      if (uVar36 < uVar11) {
        pBVar21 = pBVar7;
      }
      uVar30 = (ulong)(lVar13 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar39 = pUVar5[uVar30];
      pBVar22 = pBVar4;
      if (uVar39 < uVar11) {
        pBVar22 = pBVar7;
      }
      UVar33 = (int)src - iVar29;
      pUVar5[uVar30] = UVar33;
      UVar38 = UVar33 + 1;
      pUVar6[uVar24] = UVar33;
      if ((uVar35 < UVar38 - uVar34) && (uVar19 = UVar38 - uVar35, 2 < (uVar11 - 1) - uVar19)) {
        pBVar23 = pBVar4;
        if (uVar19 < uVar11) {
          pBVar23 = pBVar7;
        }
        if (*(int *)(pBVar23 + uVar19) != *(int *)((long)src + 1)) goto LAB_005af11a;
        plVar28 = (long *)((long)src + 1);
        pBVar21 = pInLimit;
        if (uVar19 < uVar11) {
          pBVar21 = pBVar20;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 5),pBVar23 + (ulong)uVar19 + 4,pInLimit,pBVar21,
                            (BYTE *)plVar26);
        uVar24 = (long)plVar28 - (long)plVar31;
        plVar40 = (long *)seqStore->lit;
        if (plVar15 < plVar28) {
          ZSTD_safecopyLiterals((BYTE *)plVar40,(BYTE *)plVar31,(BYTE *)plVar28,(BYTE *)plVar15);
LAB_005af1ef:
          seqStore->lit = seqStore->lit + uVar24;
          psVar14 = seqStore->sequences;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar13 = plVar31[1];
          *plVar40 = *plVar31;
          plVar40[1] = lVar13;
          pBVar21 = seqStore->lit;
          if (0x10 < uVar24) {
            lVar13 = plVar31[3];
            *(long *)(pBVar21 + 0x10) = plVar31[2];
            *(long *)(pBVar21 + 0x18) = lVar13;
            if (0x20 < (long)uVar24) {
              lVar13 = 0;
              do {
                puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x20);
                uVar8 = puVar3[1];
                pBVar22 = pBVar21 + lVar13 + 0x20;
                *(undefined8 *)pBVar22 = *puVar3;
                *(undefined8 *)(pBVar22 + 8) = uVar8;
                puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x30);
                uVar8 = puVar3[1];
                *(undefined8 *)(pBVar22 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar22 + 0x18) = uVar8;
                lVar13 = lVar13 + 0x20;
              } while (pBVar22 + 0x20 < pBVar21 + uVar24);
            }
            goto LAB_005af1ef;
          }
          seqStore->lit = pBVar21 + uVar24;
          psVar14 = seqStore->sequences;
        }
        lVar13 = sVar12 + 4;
        uVar30 = sVar12 + 1;
        psVar14->litLength = (U16)uVar24;
        psVar14->offset = 1;
        uVar39 = uVar35;
      }
      else {
LAB_005af11a:
        if ((uVar34 < uVar39) && (plVar40 = (long *)(pBVar22 + uVar39), *plVar40 == lVar13)) {
          plVar41 = plVar26;
          pBVar21 = pInLimit;
          if (uVar39 < uVar11) {
            plVar41 = plVar1;
            pBVar21 = pBVar20;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 8),(BYTE *)(plVar40 + 1),pInLimit,pBVar21,
                              (BYTE *)plVar26);
          for (lVar25 = 0;
              ((plVar28 = (long *)((long)src + lVar25), plVar41 < (long *)((long)plVar40 + lVar25)
               && (plVar31 < plVar28)) &&
              (*(BYTE *)((long)src + lVar25 + -1) == *(BYTE *)((long)plVar40 + lVar25 + -1)));
              lVar25 = lVar25 + -1) {
          }
          uVar24 = (long)plVar28 - (long)plVar31;
          plVar40 = (long *)seqStore->lit;
          if (plVar15 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar40,(BYTE *)plVar31,(BYTE *)plVar28,(BYTE *)plVar15);
LAB_005af2ce:
            seqStore->lit = seqStore->lit + (long)((long)src + (lVar25 - (long)plVar31));
            psVar14 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar13 = plVar31[1];
            *plVar40 = *plVar31;
            plVar40[1] = lVar13;
            pBVar21 = seqStore->lit;
            if (0x10 < uVar24) {
              lVar13 = plVar31[3];
              *(long *)(pBVar21 + 0x10) = plVar31[2];
              *(long *)(pBVar21 + 0x18) = lVar13;
              if (0x20 < (long)uVar24) {
                lVar13 = 0;
                do {
                  puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x20);
                  uVar8 = puVar3[1];
                  pBVar22 = pBVar21 + lVar13 + 0x20;
                  *(undefined8 *)pBVar22 = *puVar3;
                  *(undefined8 *)(pBVar22 + 8) = uVar8;
                  puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x30);
                  uVar8 = puVar3[1];
                  *(undefined8 *)(pBVar22 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar22 + 0x18) = uVar8;
                  lVar13 = lVar13 + 0x20;
                } while (pBVar22 + 0x20 < pBVar21 + (long)((long)src + (lVar25 - (long)plVar31)));
              }
              goto LAB_005af2ce;
            }
            seqStore->lit = pBVar21 + (long)((long)src + (lVar25 - (long)plVar31));
            psVar14 = seqStore->sequences;
          }
          uVar30 = (sVar12 - lVar25) + 5;
          lVar13 = (sVar12 - lVar25) + 8;
          psVar14->litLength = (short)lVar25 + ((short)src - (short)plVar31);
          psVar14->offset = (UVar33 - uVar39) + 3;
          uVar39 = UVar33 - uVar39;
          local_d4 = uVar35;
        }
        else {
          if ((uVar36 <= uVar34) ||
             (plVar28 = (long *)(pBVar21 + uVar36), (int)*plVar28 != (int)*src)) {
            src = (void *)((long)src + ((long)src - (long)plVar31 >> 8) + 1);
            goto LAB_005af00f;
          }
          lVar13 = *(long *)((long)src + 1);
          uVar24 = (ulong)(lVar13 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
          uVar39 = pUVar5[uVar24];
          pBVar21 = pBVar4;
          if (uVar39 < uVar11) {
            pBVar21 = pBVar7;
          }
          pUVar5[uVar24] = UVar38;
          if ((uVar34 < uVar39) && (plVar40 = (long *)(pBVar21 + uVar39), *plVar40 == lVar13)) {
            plVar28 = (long *)((long)src + 1);
            plVar41 = plVar26;
            pBVar21 = pInLimit;
            if (uVar39 < uVar11) {
              plVar41 = plVar1;
              pBVar21 = pBVar20;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 9),(BYTE *)(plVar40 + 1),pInLimit,pBVar21,
                                (BYTE *)plVar26);
            lVar13 = sVar12 + 8;
            uVar39 = UVar38 - uVar39;
            for (; ((src = plVar28, plVar41 < plVar40 && (plVar31 < plVar28)) &&
                   (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar40 + -1)));
                plVar28 = (long *)((long)plVar28 + -1)) {
              plVar40 = (long *)((long)plVar40 + -1);
              lVar13 = lVar13 + 1;
            }
          }
          else {
            plVar40 = plVar26;
            pBVar21 = pInLimit;
            if (uVar36 < uVar11) {
              plVar40 = plVar1;
              pBVar21 = pBVar20;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)plVar28 + 4),pInLimit,pBVar21
                                ,(BYTE *)plVar26);
            lVar13 = sVar12 + 4;
            uVar39 = UVar33 - uVar36;
            for (; ((plVar40 < plVar28 && (plVar31 < src)) &&
                   (*(BYTE *)((long)src + -1) == *(BYTE *)((long)plVar28 + -1)));
                src = (void *)((long)src + -1)) {
              plVar28 = (long *)((long)plVar28 + -1);
              lVar13 = lVar13 + 1;
            }
          }
          uVar24 = (long)src - (long)plVar31;
          plVar28 = (long *)seqStore->lit;
          if (plVar15 < src) {
            ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)plVar31,(BYTE *)src,(BYTE *)plVar15);
LAB_005af46e:
            seqStore->lit = seqStore->lit + uVar24;
            psVar14 = seqStore->sequences;
            if (0xffff < uVar24) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar25 = plVar31[1];
            *plVar28 = *plVar31;
            plVar28[1] = lVar25;
            pBVar21 = seqStore->lit;
            if (0x10 < uVar24) {
              lVar25 = plVar31[3];
              *(long *)(pBVar21 + 0x10) = plVar31[2];
              *(long *)(pBVar21 + 0x18) = lVar25;
              if (0x20 < (long)uVar24) {
                lVar25 = 0;
                do {
                  puVar3 = (undefined8 *)((long)plVar31 + lVar25 + 0x20);
                  uVar8 = puVar3[1];
                  pBVar22 = pBVar21 + lVar25 + 0x20;
                  *(undefined8 *)pBVar22 = *puVar3;
                  *(undefined8 *)(pBVar22 + 8) = uVar8;
                  puVar3 = (undefined8 *)((long)plVar31 + lVar25 + 0x30);
                  uVar8 = puVar3[1];
                  *(undefined8 *)(pBVar22 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar22 + 0x18) = uVar8;
                  lVar25 = lVar25 + 0x20;
                } while (pBVar22 + 0x20 < pBVar21 + uVar24);
              }
              goto LAB_005af46e;
            }
            seqStore->lit = pBVar21 + uVar24;
            psVar14 = seqStore->sequences;
          }
          uVar30 = lVar13 - 3;
          psVar14->litLength = (U16)uVar24;
          psVar14->offset = uVar39 + 3;
          plVar28 = (long *)src;
          local_d4 = uVar35;
        }
      }
      if (0xffff < uVar30) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      src = (void *)(lVar13 + (long)plVar28);
      psVar14->matchLength = (U16)uVar30;
      seqStore->sequences = psVar14 + 1;
      uVar35 = uVar39;
      plVar31 = (long *)src;
      if (src <= plVar2) {
        uVar36 = UVar33 + 2;
        lVar13 = *(long *)(pBVar4 + uVar36);
        uVar24 = lVar13 * -0x30e44323485a9b9d;
        pUVar5[uVar24 >> (bVar18 & 0x3f)] = uVar36;
        pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
             ((int)src + -2) - iVar29;
        switch(uVar32) {
        case 0:
          lVar25 = -0x30e4432345000000;
          break;
        case 1:
          lVar25 = -0x30e4432340650000;
          break;
        case 2:
          lVar25 = -0x30e44323405a9d00;
          break;
        case 3:
          pUVar6[uVar24 >> (bVar16 & 0x3f)] = uVar36;
          uVar24 = *(long *)((long)src + -1) * -0x30e44323485a9b9d;
          goto LAB_005af7da;
        default:
          pUVar6[(uint)(*(int *)(pBVar4 + uVar36) * -0x61c8864f) >> (bVar17 & 0x1f)] = uVar36;
          uVar24 = (ulong)((uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar17 & 0x1f));
          goto LAB_005af7dd;
        }
        pUVar6[(ulong)(lVar13 * lVar25) >> (bVar16 & 0x3f)] = uVar36;
        uVar24 = lVar25 * *(long *)((long)src + -1);
LAB_005af7da:
        uVar24 = uVar24 >> (bVar16 & 0x3f);
LAB_005af7dd:
        pUVar6[uVar24] = ((int)src + -1) - iVar29;
        for (; uVar35 = uVar39, plVar31 = (long *)src, src <= plVar2;
            src = (void *)((long)src + sVar12 + 4)) {
          UVar33 = (int)src - iVar29;
          uVar36 = UVar33 - local_d4;
          pBVar21 = pBVar4;
          if (uVar36 < uVar11) {
            pBVar21 = pBVar7;
          }
          if (((UVar33 - uVar34 <= local_d4) || ((uVar11 - 1) - uVar36 < 3)) ||
             (*(int *)(pBVar21 + uVar36) != (int)*src)) break;
          pBVar22 = pInLimit;
          if (uVar36 < uVar11) {
            pBVar22 = pBVar20;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar36) + 4),
                              pInLimit,pBVar22,(BYTE *)plVar26);
          op = (int *)seqStore->lit;
          if (plVar15 < src) {
            ZSTD_safecopyLiterals((BYTE *)op,(BYTE *)src,(BYTE *)src,(BYTE *)plVar15);
          }
          else {
            iVar37 = *(int *)((long)src + 4);
            lVar13 = *(long *)((long)src + 8);
            iVar27 = *(int *)((long)src + 0xc);
            *op = (int)*src;
            op[1] = iVar37;
            op[2] = (int)lVar13;
            op[3] = iVar27;
          }
          psVar14 = seqStore->sequences;
          psVar14->litLength = 0;
          psVar14->offset = 1;
          if (0xffff < sVar12 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->matchLength = (U16)(sVar12 + 1);
          seqStore->sequences = psVar14 + 1;
          if (mls - 5 < 4) {
            sVar12 = (*(code *)(&DAT_006d201c + *(int *)(&DAT_006d201c + uVar32 * 4)))();
            return sVar12;
          }
          lVar13 = *src;
          pUVar6[(uint)((int)*src * -0x61c8864f) >> (bVar17 & 0x1f)] = UVar33;
          pUVar5[(ulong)(lVar13 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar33;
          uVar39 = local_d4;
          local_d4 = uVar35;
        }
      }
    } while( true );
  }
  uVar34 = iVar37 - uVar36;
  if (iVar37 - uVar11 <= uVar36) {
    uVar34 = uVar11;
  }
  if (UVar33 != 0) {
    uVar34 = uVar11;
  }
  plVar15 = (long *)(pBVar4 + uVar34);
  plVar26 = (long *)((ulong)((int)src == (int)plVar15) + (long)src);
  iVar37 = (int)plVar26 - iVar29;
  uVar39 = iVar37 - uVar36;
  if (iVar37 - uVar11 <= uVar36) {
    uVar39 = uVar11;
  }
  if (UVar33 != 0) {
    uVar39 = uVar11;
  }
  uVar39 = iVar37 - uVar39;
  local_f0 = local_d4;
  if (uVar39 < local_d4) {
    local_f0 = 0;
  }
  uVar11 = uVar35;
  if (uVar39 < uVar35) {
    uVar11 = 0;
  }
  bVar18 = 0x40 - cVar10;
  bVar16 = 0x40 - cVar9;
  bVar17 = 0x20 - cVar9;
  plVar1 = (long *)(pInLimit + -0x20);
LAB_005afadb:
LAB_005afae2:
  if (plVar2 <= plVar26) {
    uVar34 = 0;
    if (uVar39 < local_d4) {
      uVar34 = local_d4;
    }
    local_d4 = uVar34;
    if (uVar39 < uVar35) {
      local_d4 = uVar35;
    }
    if (uVar11 == 0) {
      uVar11 = local_d4;
    }
    *rep = uVar11;
    if (local_f0 != 0) {
      local_d4 = local_f0;
    }
    goto LAB_005b02b5;
  }
  lVar13 = *plVar26;
  uVar24 = lVar13 * -0x30e44323485a9b9d;
  uVar32 = uVar24 >> (bVar18 & 0x3f);
  iVar37 = mls - 5;
  switch(iVar37) {
  case 0:
    lVar25 = -0x30e4432345000000;
    break;
  case 1:
    lVar25 = -0x30e4432340650000;
    break;
  case 2:
    lVar25 = -0x30e44323405a9d00;
    break;
  case 3:
    goto switchD_005afb2f_caseD_3;
  default:
    uVar24 = (ulong)((uint)((int)lVar13 * -0x61c8864f) >> (bVar17 & 0x1f));
    goto LAB_005afb52;
  }
  uVar24 = lVar25 * lVar13;
switchD_005afb2f_caseD_3:
  uVar24 = uVar24 >> (bVar16 & 0x3f);
LAB_005afb52:
  iVar27 = (int)plVar26;
  UVar33 = iVar27 - iVar29;
  uVar36 = pUVar5[uVar32];
  uVar19 = pUVar6[uVar24];
  plVar28 = (long *)((long)plVar26 + 1);
  pUVar6[uVar24] = UVar33;
  pUVar5[uVar32] = UVar33;
  if ((uVar11 == 0) || (*(int *)((long)plVar26 + -(ulong)uVar11 + 1) != *(int *)((long)plVar26 + 1))
     ) {
    if ((uVar34 < uVar36) && (plVar40 = (long *)(pBVar4 + uVar36), *plVar40 == lVar13)) {
      sVar12 = ZSTD_count((BYTE *)(plVar26 + 1),(BYTE *)(plVar40 + 1),pInLimit);
      local_e0 = sVar12 + 8;
      local_f0 = iVar27 - (int)plVar40;
      for (; ((plVar28 = plVar26, plVar15 < plVar40 && (plVar31 < plVar26)) &&
             (*(BYTE *)((long)plVar26 + -1) == *(BYTE *)((long)plVar40 + -1)));
          plVar26 = (long *)((long)plVar26 + -1)) {
        plVar40 = (long *)((long)plVar40 + -1);
        local_e0 = local_e0 + 1;
      }
      goto LAB_005b0173;
    }
    if ((uVar34 < uVar19) && (plVar40 = (long *)(pBVar4 + uVar19), (int)*plVar40 == (int)*plVar26))
    goto LAB_005afd5a;
    plVar26 = (long *)((long)plVar26 + ((long)plVar26 - (long)plVar31 >> 8) + 1);
    goto LAB_005afae2;
  }
  sVar12 = ZSTD_count((BYTE *)((long)plVar26 + 5),(BYTE *)((long)plVar26 + -(ulong)uVar11 + 5),
                      pInLimit);
  uVar32 = (long)plVar28 - (long)plVar31;
  plVar26 = (long *)seqStore->lit;
  if (plVar1 < plVar28) {
    ZSTD_safecopyLiterals((BYTE *)plVar26,(BYTE *)plVar31,(BYTE *)plVar28,(BYTE *)plVar1);
    goto LAB_005afc45;
  }
  lVar13 = plVar31[1];
  *plVar26 = *plVar31;
  plVar26[1] = lVar13;
  pBVar7 = seqStore->lit;
  if (uVar32 < 0x11) {
    seqStore->lit = pBVar7 + uVar32;
    psVar14 = seqStore->sequences;
  }
  else {
    lVar13 = plVar31[3];
    *(long *)(pBVar7 + 0x10) = plVar31[2];
    *(long *)(pBVar7 + 0x18) = lVar13;
    if (0x20 < (long)uVar32) {
      lVar13 = 0;
      do {
        puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x20);
        uVar8 = puVar3[1];
        pBVar20 = pBVar7 + lVar13 + 0x20;
        *(undefined8 *)pBVar20 = *puVar3;
        *(undefined8 *)(pBVar20 + 8) = uVar8;
        puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x30);
        uVar8 = puVar3[1];
        *(undefined8 *)(pBVar20 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar20 + 0x18) = uVar8;
        lVar13 = lVar13 + 0x20;
      } while (pBVar20 + 0x20 < pBVar7 + uVar32);
    }
LAB_005afc45:
    seqStore->lit = seqStore->lit + uVar32;
    psVar14 = seqStore->sequences;
    if (0xffff < uVar32) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  local_e0 = sVar12 + 4;
  uVar24 = sVar12 + 1;
  psVar14->litLength = (U16)uVar32;
  psVar14->offset = 1;
  uVar36 = local_f0;
  goto joined_r0x005b0264;
LAB_005afd5a:
  lVar13 = *plVar28;
  uVar32 = (ulong)(lVar13 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
  uVar36 = pUVar5[uVar32];
  pUVar5[uVar32] = UVar33 + 1;
  if ((uVar34 < uVar36) && (plVar41 = (long *)(pBVar4 + uVar36), *plVar41 == lVar13)) {
    sVar12 = ZSTD_count((BYTE *)((long)plVar26 + 9),(BYTE *)(plVar41 + 1),pInLimit);
    local_e0 = sVar12 + 8;
    local_f0 = (int)plVar28 - (int)plVar41;
    for (; ((plVar15 < plVar41 && (plVar31 < plVar28)) &&
           (*(BYTE *)((long)plVar28 + -1) == *(BYTE *)((long)plVar41 + -1)));
        plVar28 = (long *)((long)plVar28 + -1)) {
      plVar41 = (long *)((long)plVar41 + -1);
      local_e0 = local_e0 + 1;
    }
  }
  else {
    sVar12 = ZSTD_count((BYTE *)((long)plVar26 + 4),(BYTE *)((long)plVar40 + 4),pInLimit);
    local_e0 = sVar12 + 4;
    local_f0 = iVar27 - (int)plVar40;
    for (; ((plVar28 = plVar26, plVar15 < plVar40 && (plVar31 < plVar26)) &&
           (*(BYTE *)((long)plVar26 + -1) == *(BYTE *)((long)plVar40 + -1)));
        plVar26 = (long *)((long)plVar26 + -1)) {
      plVar40 = (long *)((long)plVar40 + -1);
      local_e0 = local_e0 + 1;
    }
  }
LAB_005b0173:
  uVar32 = (long)plVar28 - (long)plVar31;
  plVar26 = (long *)seqStore->lit;
  if (plVar1 < plVar28) {
    ZSTD_safecopyLiterals((BYTE *)plVar26,(BYTE *)plVar31,(BYTE *)plVar28,(BYTE *)plVar1);
LAB_005b019e:
    seqStore->lit = seqStore->lit + uVar32;
    psVar14 = seqStore->sequences;
    if (0xffff < uVar32) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    lVar13 = plVar31[1];
    *plVar26 = *plVar31;
    plVar26[1] = lVar13;
    pBVar7 = seqStore->lit;
    if (0x10 < uVar32) {
      lVar13 = plVar31[3];
      *(long *)(pBVar7 + 0x10) = plVar31[2];
      *(long *)(pBVar7 + 0x18) = lVar13;
      if (0x20 < (long)uVar32) {
        lVar13 = 0;
        do {
          puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x20);
          uVar8 = puVar3[1];
          pBVar20 = pBVar7 + lVar13 + 0x20;
          *(undefined8 *)pBVar20 = *puVar3;
          *(undefined8 *)(pBVar20 + 8) = uVar8;
          puVar3 = (undefined8 *)((long)plVar31 + lVar13 + 0x30);
          uVar8 = puVar3[1];
          *(undefined8 *)(pBVar20 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar20 + 0x18) = uVar8;
          lVar13 = lVar13 + 0x20;
        } while (pBVar20 + 0x20 < pBVar7 + uVar32);
      }
      goto LAB_005b019e;
    }
    seqStore->lit = pBVar7 + uVar32;
    psVar14 = seqStore->sequences;
  }
  uVar24 = local_e0 - 3;
  psVar14->litLength = (U16)uVar32;
  psVar14->offset = local_f0 + 3;
  uVar36 = uVar11;
  uVar11 = local_f0;
joined_r0x005b0264:
  local_f0 = uVar36;
  if (0xffff < uVar24) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  plVar26 = (long *)(local_e0 + (long)plVar28);
  psVar14->matchLength = (U16)uVar24;
  seqStore->sequences = psVar14 + 1;
  plVar31 = plVar26;
  if (plVar2 < plVar26) goto LAB_005afadb;
  uVar36 = UVar33 + 2;
  lVar13 = *(long *)(pBVar4 + uVar36);
  uVar32 = lVar13 * -0x30e44323485a9b9d;
  pUVar5[uVar32 >> (bVar18 & 0x3f)] = uVar36;
  pUVar5[(ulong)(*(long *)((long)plVar26 + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
       ((int)plVar26 + -2) - iVar29;
  switch(iVar37) {
  case 0:
    lVar25 = -0x30e4432345000000;
    break;
  case 1:
    lVar25 = -0x30e4432340650000;
    break;
  case 2:
    lVar25 = -0x30e44323405a9d00;
    break;
  case 3:
    pUVar6[uVar32 >> (bVar16 & 0x3f)] = uVar36;
    uVar32 = *(long *)((long)plVar26 + -1) * -0x30e44323485a9b9d;
    goto LAB_005affa7;
  default:
    pUVar6[(uint)(*(int *)(pBVar4 + uVar36) * -0x61c8864f) >> (bVar17 & 0x1f)] = uVar36;
    uVar32 = (ulong)((uint)(*(int *)((long)plVar26 + -1) * -0x61c8864f) >> (bVar17 & 0x1f));
    goto LAB_005affaa;
  }
  pUVar6[(ulong)(lVar13 * lVar25) >> (bVar16 & 0x3f)] = uVar36;
  uVar32 = lVar25 * *(long *)((long)plVar26 + -1);
LAB_005affa7:
  uVar32 = uVar32 >> (bVar16 & 0x3f);
LAB_005affaa:
  pUVar6[uVar32] = ((int)plVar26 + -1) - iVar29;
  uVar36 = local_f0;
  for (; local_f0 = uVar36, plVar31 = plVar26, plVar26 <= plVar2;
      plVar26 = (long *)((long)plVar26 + sVar12 + 4)) {
    lVar13 = *plVar26;
    if ((local_f0 == 0) || ((int)lVar13 != *(int *)((long)plVar26 - (ulong)local_f0))) break;
    sVar12 = ZSTD_count((BYTE *)((long)plVar26 + 4),(BYTE *)((long)plVar26 + (4 - (ulong)local_f0)),
                        pInLimit);
    switch(iVar37) {
    case 0:
      lVar13 = *plVar26;
      lVar25 = -0x30e4432345000000;
      break;
    case 1:
      lVar13 = *plVar26;
      lVar25 = -0x30e4432340650000;
      break;
    case 2:
      lVar13 = *plVar26;
      lVar25 = -0x30e44323405a9d00;
      break;
    case 3:
      lVar13 = *plVar26;
      uVar32 = lVar13 * -0x30e44323485a9b9d;
      goto LAB_005b0060;
    default:
      uVar32 = (ulong)((uint)((int)lVar13 * -0x61c8864f) >> (bVar17 & 0x1f));
      lVar13 = *plVar26;
      goto LAB_005b0068;
    }
    uVar32 = lVar25 * lVar13;
LAB_005b0060:
    uVar32 = uVar32 >> (bVar16 & 0x3f);
LAB_005b0068:
    UVar33 = (int)plVar26 - iVar29;
    pUVar6[uVar32] = UVar33;
    pUVar5[(ulong)(lVar13 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar33;
    plVar31 = (long *)seqStore->lit;
    if (plVar1 < plVar26) {
      ZSTD_safecopyLiterals((BYTE *)plVar31,(BYTE *)plVar26,(BYTE *)plVar26,(BYTE *)plVar1);
    }
    else {
      lVar13 = plVar26[1];
      *plVar31 = *plVar26;
      plVar31[1] = lVar13;
    }
    psVar14 = seqStore->sequences;
    psVar14->litLength = 0;
    psVar14->offset = 1;
    if (0xffff < sVar12 + 1) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar14->matchLength = (U16)(sVar12 + 1);
    seqStore->sequences = psVar14 + 1;
    uVar36 = uVar11;
    uVar11 = local_f0;
  }
  goto LAB_005afadb;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 < curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 < current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}